

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

void polygon_web_init(Am_Slot *slot,Am_Web_Init *init)

{
  Am_Object_Advanced obj;
  Am_Object AStack_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Slot::Get_Owner((Am_Slot *)&AStack_68);
  Am_Object::Am_Object(&local_18,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_18,0xb2);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&local_20,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_20,100);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_28,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_28,0x65);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_30,0x66);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_38,0x67);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object(&local_40,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_40,0x6b);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&local_48,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_48,0xb2);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_50,0x65);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_58,0x66);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&local_60,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_60,0x67);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&AStack_68);
  return;
}

Assistant:

static void
polygon_web_init(const Am_Slot &slot, Am_Web_Init &init)
{
  Am_Object_Advanced obj = slot.Get_Owner();
  init.Note_Input(obj, Am_POINT_LIST);
  init.Note_Input(obj, Am_LEFT);
  init.Note_Input(obj, Am_TOP);
  init.Note_Input(obj, Am_WIDTH);
  init.Note_Input(obj, Am_HEIGHT);
  init.Note_Input(obj, Am_LINE_STYLE);
  init.Note_Output(obj, Am_POINT_LIST);
  init.Note_Output(obj, Am_TOP);
  init.Note_Output(obj, Am_WIDTH);
  init.Note_Output(obj, Am_HEIGHT);
}